

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::hex_writer>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::hex_writer>
             *this,char **it)

{
  int iVar1;
  size_t __n;
  size_t __n_00;
  bool bVar2;
  char *digits;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  size_t __len;
  ptrdiff_t _Num;
  
  __n = *(size_t *)(this + 0x10);
  pcVar4 = *it;
  pcVar3 = pcVar4;
  if (__n != 0) {
    memmove(pcVar4,*(void **)(this + 8),__n);
    pcVar3 = pcVar4 + __n;
    *it = pcVar3;
  }
  __n_00 = *(size_t *)(this + 0x20);
  pcVar6 = pcVar3;
  if (__n_00 != 0) {
    pcVar6 = pcVar3 + __n_00;
    memset(pcVar3,*(int *)(this + 0x18),__n_00);
  }
  *it = pcVar6;
  iVar1 = *(int *)(this + 0x30);
  if (*(char *)(*(long *)(*(long *)(this + 0x28) + 8) + 8) == 'x') {
    pcVar3 = "0123456789abcdef";
  }
  else {
    pcVar3 = "0123456789ABCDEF";
  }
  pcVar4 = pcVar4 + __n_00 + __n + (long)iVar1;
  uVar5 = *(uint *)(*(long *)(this + 0x28) + 0x10);
  do {
    pcVar4 = pcVar4 + -1;
    *pcVar4 = pcVar3[uVar5 & 0xf];
    bVar2 = 0xf < uVar5;
    uVar5 = uVar5 >> 4;
  } while (bVar2);
  *it = pcVar6 + iVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }